

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhsts_p.h
# Opt level: O2

bool __thiscall QHstsCache::HostName::operator<(HostName *this,HostName *rhs)

{
  long lVar1;
  bool bVar2;
  QStringView *rhs_00;
  QStringView *lhs;
  long in_FS_OFFSET;
  QStringView local_18;
  long local_8;
  
  lhs = &local_18;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  rhs_00 = &rhs->fragment;
  lVar1 = (rhs->fragment).m_size;
  if ((this->fragment).m_size == 0) {
    if (lVar1 == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        bVar2 = ::operator<(&this->name,&rhs->name);
        return bVar2;
      }
      goto LAB_0016dac9;
    }
    local_18.m_data = (this->name).d.ptr;
    local_18.m_size = (this->name).d.size;
  }
  else {
    lhs = &this->fragment;
    if (lVar1 != 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        bVar2 = ::operator<(lhs,rhs_00);
        return bVar2;
      }
      goto LAB_0016dac9;
    }
    local_18.m_data = (rhs->name).d.ptr;
    local_18.m_size = (rhs->name).d.size;
    rhs_00 = &local_18;
  }
  bVar2 = ::operator<(lhs,rhs_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar2;
  }
LAB_0016dac9:
  __stack_chk_fail();
}

Assistant:

bool operator < (const HostName &rhs) const
        {
            if (fragment.size()) {
                if (rhs.fragment.size())
                    return fragment < rhs.fragment;
                return fragment < QStringView{rhs.name};
            }

            if (rhs.fragment.size())
                return QStringView{name} < rhs.fragment;
            return name < rhs.name;
        }